

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaIf.c
# Opt level: O2

Gia_Man_t *
Gia_ManPerformDsdBalance(Gia_Man_t *p,int nLutSize,int nCutNum,int nRelaxRatio,int fVerbose)

{
  void *pvVar1;
  If_DsdMan_t *pIVar2;
  If_Man_t *p_00;
  Gia_Man_t *p_01;
  char *pcVar3;
  If_Par_t Pars;
  
  If_ManSetDefaultPars(&Pars);
  Pars.fCutMin = 1;
  Pars.fExpRed = 0;
  Pars.nLutSize = nLutSize;
  Pars.nCutsMax = nCutNum;
  Pars.nRelaxRatio = nRelaxRatio;
  Pars.fDsdBalance = Pars.fCutMin;
  Pars.fUseDsd = Pars.fCutMin;
  Pars.fVerbose = fVerbose;
  Pars.fTruth = Pars.fCutMin;
  pvVar1 = Abc_FrameReadManDsd2();
  if (pvVar1 == (void *)0x0) {
    pIVar2 = If_DsdManAlloc(Pars.nLutSize,0);
    Abc_FrameSetManDsd2(pIVar2);
  }
  p_00 = Gia_ManToIf(p,&Pars);
  pIVar2 = (If_DsdMan_t *)Abc_FrameReadManDsd2();
  p_00->pIfDsdMan = pIVar2;
  if (Pars.fDsdBalance != 0) {
    If_DsdManAllocIsops(pIVar2,Pars.nLutSize);
  }
  If_ManPerformMapping(p_00);
  p_01 = Gia_ManFromIfAig(p_00);
  If_ManStop(p_00);
  Gia_ManTransferTiming(p_01,p);
  if (p_01->pName == (char *)0x0) {
    pcVar3 = Abc_UtilStrsav(p->pName);
    p_01->pName = pcVar3;
    pcVar3 = Abc_UtilStrsav(p->pSpec);
    p_01->pSpec = pcVar3;
    Gia_ManSetRegNum(p_01,p->nRegs);
    return p_01;
  }
  __assert_fail("pNew->pName == NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaIf.c"
                ,0x8e0,"Gia_Man_t *Gia_ManPerformDsdBalance(Gia_Man_t *, int, int, int, int)");
}

Assistant:

Gia_Man_t * Gia_ManPerformDsdBalance( Gia_Man_t * p, int nLutSize, int nCutNum, int nRelaxRatio, int fVerbose )
{
    Gia_Man_t * pNew;
    If_Man_t * pIfMan;
    If_Par_t Pars, * pPars = &Pars;
    If_ManSetDefaultPars( pPars );
    pPars->nCutsMax    = nCutNum;
    pPars->nRelaxRatio = nRelaxRatio;
    pPars->fVerbose    = fVerbose;
    pPars->nLutSize    = nLutSize;
    pPars->fDsdBalance = 1;
    pPars->fUseDsd     = 1;
    pPars->fCutMin     = 1;
    pPars->fTruth      = 1;
    pPars->fExpRed     = 0;
    if ( Abc_FrameReadManDsd2() == NULL )
        Abc_FrameSetManDsd2( If_DsdManAlloc(pPars->nLutSize, 0) );
    // perform mapping
    pIfMan = Gia_ManToIf( p, pPars );
    pIfMan->pIfDsdMan = (If_DsdMan_t *)Abc_FrameReadManDsd2();
    if ( pPars->fDsdBalance )
        If_DsdManAllocIsops( pIfMan->pIfDsdMan, pPars->nLutSize );
    If_ManPerformMapping( pIfMan );
    pNew = Gia_ManFromIfAig( pIfMan );
    If_ManStop( pIfMan );
    Gia_ManTransferTiming( pNew, p );
    // transfer name
    assert( pNew->pName == NULL );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    Gia_ManSetRegNum( pNew, Gia_ManRegNum(p) );
    return pNew;
}